

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O3

void __thiscall
bloaty::sourcemap::SourceMapObjectFile::ProcessFileToSink(SourceMapObjectFile *this,RangeSink *sink)

{
  char cVar1;
  InputFile *pIVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 uVar7;
  char *str;
  Arg *in_R9;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  sources;
  int32_t values [5];
  string_view local_110;
  string local_100;
  int local_dc;
  undefined1 local_d8 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_c8;
  undefined1 local_b8 [8];
  _Alloc_hider _Stack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  Arg local_88;
  undefined8 local_58;
  undefined8 uStack_50;
  RangeSink *local_40;
  long local_38;
  
  if (1 < sink->data_source_ - kCompileUnits) {
    Throw("Source map doesn\'t support this data source",0xdb);
  }
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_110._M_len = (pIVar2->data_)._M_len;
  if (local_110._M_len == 0) {
    Throw("premature EOF reading fixed-length data",0x8d);
  }
  local_110._M_str = (pIVar2->data_)._M_str + 1;
  local_110._M_len = local_110._M_len - 1;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  FindField(&local_110,"sources");
  if (local_110._M_len == 0) {
    local_b8 = (undefined1  [8])0x3;
    _Stack_b0._M_p = "EOF";
  }
  else {
    if (*local_110._M_str == '[') {
      local_110._M_str = local_110._M_str + 1;
      local_110._M_len = local_110._M_len - 1;
      if (local_110._M_len != 0) {
        do {
          SkipWhitespace(&local_110);
          if (local_110._M_len == 0) break;
          if (*local_110._M_str == ',') {
            local_110._M_str = local_110._M_str + 1;
            local_110._M_len = local_110._M_len - 1;
          }
          else if (*local_110._M_str == ']') {
            local_110._M_str = local_110._M_str + 1;
            local_110._M_len = local_110._M_len - 1;
            break;
          }
          _local_b8 = ReadQuotedString(&local_110);
          if ((basic_string_view<char,_std::char_traits<char>_> *)local_d8._8_8_ == local_c8) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)local_d8,(iterator)local_d8._8_8_,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_b8);
          }
          else {
            *(size_t *)local_d8._8_8_ = (size_t)local_b8;
            *(pointer *)(local_d8._8_8_ + 8) = _Stack_b0._M_p;
            local_d8._8_8_ =
                 (basic_string_view<char,_std::char_traits<char>_> *)(local_d8._8_8_ + 0x10);
          }
        } while (local_110._M_len != 0);
      }
      SkipWhitespace(&local_110);
      if (local_110._M_len == 0) {
        local_b8 = (undefined1  [8])0x3;
        _Stack_b0._M_p = "EOF";
      }
      else {
        if (*local_110._M_str == ',') {
          local_110._M_str = local_110._M_str + 1;
          local_110._M_len = local_110._M_len - 1;
          FindField(&local_110,"mappings");
          if (local_110._M_len == 0) {
            local_b8 = (undefined1  [8])0x3;
            _Stack_b0._M_p = "EOF";
          }
          else {
            if (*local_110._M_str == '\"') {
              local_110._M_str = local_110._M_str + 1;
              local_110._M_len = local_110._M_len - 1;
              if (local_110._M_len != 0) {
                if (*local_110._M_str == '\"') {
LAB_0019cc42:
                  local_110._M_str = local_110._M_str + 1;
                  local_110._M_len = local_110._M_len - 1;
                  if ((void *)local_d8._0_8_ != (void *)0x0) {
                    operator_delete((void *)local_d8._0_8_,(long)local_c8 - local_d8._0_8_);
                  }
                  return;
                }
                iVar5 = ReadBase64VLQSegment(&local_110,(int32_t (*) [5])&local_88);
                local_40 = sink;
                if (iVar5 < 4) {
                  iVar5 = 0x95;
                  str = "Source file info expected in first VLQ segment";
LAB_0019ce52:
                  Throw(str,iVar5);
                }
                local_58 = local_88.piece_._M_str;
                uStack_50 = 0;
                iVar5 = (int)local_88.piece_._M_len;
                local_dc = local_88.piece_._M_len._4_4_;
                do {
                  uVar7 = true;
                  local_38 = (long)local_dc << 4;
                  do {
                    while( true ) {
                      if (local_110._M_len == 0) goto LAB_0019cdeb;
                      cVar1 = *local_110._M_str;
                      if (cVar1 != ',') break;
                      local_110._M_str = local_110._M_str + 1;
                      local_110._M_len = local_110._M_len - 1;
                    }
                    if (cVar1 == '\"') goto LAB_0019cc42;
                    if (cVar1 == ';') {
                      iVar5 = 0xa4;
                      str = "Unsupported line separator in source map";
                      goto LAB_0019ce52;
                    }
                    iVar6 = ReadBase64VLQSegment(&local_110,(int32_t (*) [5])&local_88);
                    iVar4 = (int)local_88.piece_._M_len;
                    if ((bool)uVar7) {
                      lVar3 = *(long *)(local_d8._0_8_ + 8 + local_38);
                      local_b8._4_4_ = (int)local_88.piece_._M_len;
                      local_b8._0_4_ = iVar5;
                      _Stack_b0._M_p = (pointer)&local_a0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)(local_b8 + 8),lVar3,
                                 *(long *)(local_d8._0_8_ + local_38) + lVar3);
                      local_90 = local_58;
                      VlqSegment::addToSink((VlqSegment *)local_b8,local_40);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Stack_b0._M_p != &local_a0) {
                        operator_delete(_Stack_b0._M_p,local_a0._M_allocated_capacity + 1);
                      }
                    }
                    iVar5 = iVar5 + iVar4;
                    uVar7 = false;
                  } while (iVar6 < 4);
                  local_dc = local_dc + local_88.piece_._M_len._4_4_;
                  local_58 = (char *)CONCAT44(local_58._4_4_ +
                                              (int)((ulong)local_88.piece_._M_str >> 0x20),
                                              (int)local_58 + (int)local_88.piece_._M_str);
                } while( true );
              }
LAB_0019cdeb:
              _Stack_b0._M_p = "EOF";
              local_b8 = (undefined1  [8])0x3;
              local_88.piece_._M_str = local_88.scratch_;
              local_88.piece_._M_len = 1;
              local_88.scratch_[0] = '\"';
              format._M_str = local_b8;
              format._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
              absl::Substitute_abi_cxx11_(&local_100,(absl *)0x1e,format,&local_88,in_R9);
              Throw(local_100._M_dataplus._M_p,0xb7);
            }
            local_b8 = (undefined1  [8])0x1;
            _Stack_b0._M_p = local_110._M_str;
          }
          local_88.piece_._M_str = local_88.scratch_;
          local_88.piece_._M_len = 1;
          local_88.scratch_[0] = '\"';
          format_02._M_str = local_b8;
          format_02._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
          absl::Substitute_abi_cxx11_(&local_100,(absl *)0x1e,format_02,&local_88,in_R9);
          Throw(local_100._M_dataplus._M_p,0xb7);
        }
        local_b8 = (undefined1  [8])0x1;
        _Stack_b0._M_p = local_110._M_str;
      }
      local_88.piece_._M_str = local_88.scratch_;
      local_88.piece_._M_len = 1;
      local_88.scratch_[0] = ',';
      format_01._M_str = local_b8;
      format_01._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
      absl::Substitute_abi_cxx11_(&local_100,(absl *)0x1e,format_01,&local_88,in_R9);
      Throw(local_100._M_dataplus._M_p,0xb7);
    }
    local_b8 = (undefined1  [8])0x1;
    _Stack_b0._M_p = local_110._M_str;
  }
  local_88.piece_._M_str = local_88.scratch_;
  local_88.piece_._M_len = 1;
  local_88.scratch_[0] = '[';
  format_00._M_str = local_b8;
  format_00._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
  absl::Substitute_abi_cxx11_(&local_100,(absl *)0x1e,format_00,&local_88,in_R9);
  Throw(local_100._M_dataplus._M_p,0xb7);
}

Assistant:

void addToSink(RangeSink* sink) const {
    auto name = sink->data_source() == DataSource::kInlines
        ? source_file + ":" + std::to_string(source_line)
        : source_file;
    sink->AddFileRange("sourcemap", name, col, length);
  }